

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void try_merge(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
              TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree,
              PARTITION_TYPE partition,BLOCK_SIZE subsize,int pl)

{
  undefined8 uVar1;
  uint uVar2;
  PICK_MODE_CONTEXT *pPVar3;
  long lVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R9D;
  int in_stack_00000008;
  byte in_stack_00000010;
  undefined1 *in_stack_00000018;
  byte in_stack_00000028;
  int y_idx_1;
  int x_idx_1;
  int i_1;
  int y_idx;
  int x_idx;
  RD_STATS block_rdc;
  int i;
  RD_STATS none_rdc;
  RD_STATS split_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  _Bool do_split;
  int hbs;
  int bs;
  int num_planes;
  ModeCosts *mode_costs;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile_info;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffd7c;
  undefined8 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  uint uVar5;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int local_248;
  long local_240;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  TokenExtra **in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  AV1_COMP *in_stack_fffffffffffffdf0;
  RUN_TYPE in_stack_fffffffffffffe00;
  BLOCK_SIZE in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  PICK_MODE_CONTEXT *in_stack_fffffffffffffe18;
  MACROBLOCK *in_stack_fffffffffffffe20;
  TileDataEnc *in_stack_fffffffffffffe28;
  AV1_COMP *in_stack_fffffffffffffe30;
  BLOCK_SIZE in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe54;
  CommonModeInfoParams *in_stack_fffffffffffffe58;
  RD_STATS *in_stack_fffffffffffffe60;
  PC_TREE *in_stack_fffffffffffffe68;
  MACROBLOCK *in_stack_fffffffffffffe70;
  AV1_COMP *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  BLOCK_SIZE in_stack_fffffffffffffea0;
  PARTITION_TYPE in_stack_fffffffffffffea8;
  PC_TREE_SHARED_BUFFERS *in_stack_ffffffffffffff48;
  BLOCK_SIZE in_stack_ffffffffffffff57;
  AV1_COMP *in_stack_ffffffffffffff58;
  _Bool local_75;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  uVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [in_stack_00000010] / 2;
  local_75 = false;
  av1_invalid_rd_stats((RD_STATS *)&stack0xfffffffffffffe10);
  av1_invalid_rd_stats((RD_STATS *)&stack0xfffffffffffffde8);
  av1_save_context((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (RD_SEARCH_MACROBLOCK_CONTEXT *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd98 >> 0x38),
                   (int)in_stack_fffffffffffffd98);
  *(long *)(in_RSI + 0x2160) =
       *(long *)(*(long *)(in_RDI + 0x42298) + (long)*(int *)(in_RDX + 0x10) * 8) +
       (long)in_stack_00000008;
  *(long *)(in_RSI + 0x2168) = in_RSI + 0x2170 + (long)(int)(in_R9D & 0x1f);
  *in_stack_00000018 = 0;
  if (*(long *)(in_stack_00000018 + 8) == 0) {
    pPVar3 = av1_alloc_pmc(in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,
                           in_stack_ffffffffffffff48);
    *(PICK_MODE_CONTEXT **)(in_stack_00000018 + 8) = pPVar3;
    if (*(long *)(in_stack_00000018 + 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  else {
    av1_reset_pmc((PICK_MODE_CONTEXT *)0x5a642f);
  }
  pick_sb_modes_nonrd(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                      (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18
                      ,(RD_STATS *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      in_stack_fffffffffffffe40,
                      (PICK_MODE_CONTEXT *)
                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  in_stack_fffffffffffffde8 =
       *(int *)(in_RSI + 0x4230 + (long)x_idx_1 * 0x28) + in_stack_fffffffffffffde8;
  lVar4 = ((long)in_stack_fffffffffffffde8 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
          (long)in_stack_fffffffffffffdf0 * 0x80;
  av1_restore_context((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      (RD_SEARCH_MACROBLOCK_CONTEXT *)
                      CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                      in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                      (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd98 >> 0x38),
                      (int)in_stack_fffffffffffffd98);
  if ((((*(int *)(in_RDI + 0x60ca0) < 2) || (in_stack_fffffffffffffe08 != BLOCK_4X8)) ||
      (*(char *)(*(long *)(in_stack_00000018 + 8) + 2) == '\x10')) &&
     (local_75 = calc_do_split_flag(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                    in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                                    in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                                    in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,
                                    in_stack_fffffffffffffea0,in_stack_fffffffffffffea8), local_75))
  {
    av1_init_rd_stats((RD_STATS *)&stack0xfffffffffffffe10);
    in_stack_fffffffffffffe10 =
         *(int *)(in_RSI + 0x4230 + (long)x_idx_1 * 0x28 + 0xc) + in_stack_fffffffffffffe10;
    for (in_stack_fffffffffffffde4 = 0; (int)in_stack_fffffffffffffde4 < 4;
        in_stack_fffffffffffffde4 = in_stack_fffffffffffffde4 + 1) {
      av1_invalid_rd_stats((RD_STATS *)&local_248);
      in_stack_fffffffffffffdb4 = (in_stack_fffffffffffffde4 & 1) * uVar2;
      in_stack_fffffffffffffdb0 = ((int)in_stack_fffffffffffffde4 >> 1) * uVar2;
      if (((int)(in_R9D + in_stack_fffffffffffffdb0) < *(int *)(in_RDI + 0x3c194)) &&
         (in_stack_00000008 + in_stack_fffffffffffffdb4 < *(int *)(in_RDI + 0x3c198))) {
        *(long *)(in_RSI + 0x2160) =
             *(long *)(*(long *)(in_RDI + 0x42298) + (long)*(int *)(in_RDX + 0x10) * 8) +
             (long)in_stack_00000008 + (long)in_stack_fffffffffffffdb4;
        *(long *)(in_RSI + 0x2168) =
             in_RSI + 0x2170 + (long)(int)(in_R9D + in_stack_fffffffffffffdb0 & 0x1f);
        if (*(long *)(*(long *)(in_stack_00000018 + (long)(int)in_stack_fffffffffffffde4 * 8 + 0xd0)
                     + 8) == 0) {
          pPVar3 = av1_alloc_pmc(in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,
                                 in_stack_ffffffffffffff48);
          *(PICK_MODE_CONTEXT **)
           (*(long *)(in_stack_00000018 + (long)(int)in_stack_fffffffffffffde4 * 8 + 0xd0) + 8) =
               pPVar3;
          if (*(long *)(*(long *)(in_stack_00000018 +
                                 (long)(int)in_stack_fffffffffffffde4 * 8 + 0xd0) + 8) == 0) {
            aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        else {
          av1_reset_pmc((PICK_MODE_CONTEXT *)0x5a679f);
        }
        **(undefined1 **)(in_stack_00000018 + (long)(int)in_stack_fffffffffffffde4 * 8 + 0xd0) = 0;
        uVar1 = *(undefined8 *)
                 (*(long *)(in_stack_00000018 + (long)(int)in_stack_fffffffffffffde4 * 8 + 0xd0) + 8
                 );
        uVar5 = (uint)in_stack_00000028;
        pick_sb_modes_nonrd(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                            in_stack_fffffffffffffe20,
                            (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                            (int)in_stack_fffffffffffffe18,
                            (RD_STATS *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe40,
                            (PICK_MODE_CONTEXT *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        in_stack_fffffffffffffe10 = local_248 + in_stack_fffffffffffffe10;
        in_stack_fffffffffffffe18 =
             (PICK_MODE_CONTEXT *)((long)(in_stack_fffffffffffffe18->mic).mv + local_240 + -8);
        av1_rd_cost_update((int)((ulong)uVar1 >> 0x20),
                           (RD_STATS *)CONCAT44(in_stack_fffffffffffffd7c,uVar5));
        if (lVar4 < (long)in_stack_fffffffffffffe20) break;
        if (in_stack_fffffffffffffde4 != 3) {
          in_stack_fffffffffffffd98 = 0;
          encode_b_nonrd(in_stack_fffffffffffffdf0,
                         (TileDataEnc *)
                         CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (ThreadData_conflict *)
                         CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                         in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                         in_stack_fffffffffffffdd0,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffe08,(PARTITION_TYPE)in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe18,(int *)in_stack_fffffffffffffe20);
        }
      }
    }
    av1_restore_context((MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                        (RD_SEARCH_MACROBLOCK_CONTEXT *)
                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,
                        (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd98 >> 0x38),
                        (int)in_stack_fffffffffffffd98);
    in_stack_fffffffffffffe20 =
         (MACROBLOCK *)
         (((long)in_stack_fffffffffffffe10 * (long)*(int *)(in_RSI + 0x4218) + 0x100 >> 9) +
         (long)in_stack_fffffffffffffe18 * 0x80);
  }
  if (lVar4 < (long)in_stack_fffffffffffffe20) {
    if (local_75 != false) {
      *(undefined1 *)(in_RSI + 0x1f6c2) = 0;
    }
    *(byte *)*in_RCX = in_stack_00000010;
    *in_stack_00000018 = 0;
    encode_b_nonrd(in_stack_fffffffffffffdf0,
                   (TileDataEnc *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                   (ThreadData_conflict *)
                   CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,
                   (PARTITION_TYPE)in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                   (int *)in_stack_fffffffffffffe20);
  }
  else {
    *(byte *)*in_RCX = in_stack_00000028;
    *in_stack_00000018 = 3;
    *(undefined1 *)(in_RSI + 0x1f6c2) = 0;
    for (uVar5 = 0; (int)uVar5 < 4; uVar5 = uVar5 + 1) {
      if (((int)(in_R9D + ((int)uVar5 >> 1) * uVar2) < *(int *)(in_RDI + 0x3c194)) &&
         ((int)(in_stack_00000008 + (uVar5 & 1) * uVar2) < *(int *)(in_RDI + 0x3c198))) {
        if (*(long *)(*(long *)(in_stack_00000018 + (long)(int)uVar5 * 8 + 0xd0) + 8) == 0) {
          pPVar3 = av1_alloc_pmc(in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,
                                 in_stack_ffffffffffffff48);
          *(PICK_MODE_CONTEXT **)(*(long *)(in_stack_00000018 + (long)(int)uVar5 * 8 + 0xd0) + 8) =
               pPVar3;
          if (*(long *)(*(long *)(in_stack_00000018 + (long)(int)uVar5 * 8 + 0xd0) + 8) == 0) {
            aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        encode_b_nonrd(in_stack_fffffffffffffdf0,
                       (TileDataEnc *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (ThreadData_conflict *)
                       CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                       in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0
                       ,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,
                       (PARTITION_TYPE)in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                       (int *)in_stack_fffffffffffffe20);
      }
    }
  }
  return;
}

Assistant:

static void try_merge(AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, MB_MODE_INFO **mib,
                      TokenExtra **tp, const int mi_row, const int mi_col,
                      const BLOCK_SIZE bsize, PC_TREE *const pc_tree,
                      const PARTITION_TYPE partition, const BLOCK_SIZE subsize,
                      const int pl) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int num_planes = av1_num_planes(cm);
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  bool do_split = false;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS split_rdc, none_rdc;
  av1_invalid_rd_stats(&split_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  pc_tree->partitioning = PARTITION_NONE;
  if (!pc_tree->none) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  } else {
    av1_reset_pmc(pc_tree->none);
  }
  pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &none_rdc, bsize,
                      pc_tree->none);
  none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
  none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode < 2 ||
      none_rdc.skip_txfm != 1 || pc_tree->none->mic.mode == NEWMV) {
    do_split = calc_do_split_flag(cpi, x, pc_tree, &none_rdc, mi_params, mi_row,
                                  mi_col, hbs, bsize, partition);
    if (do_split) {
      av1_init_rd_stats(&split_rdc);
      split_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        RD_STATS block_rdc;
        av1_invalid_rd_stats(&block_rdc);
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;
        xd->above_txfm_context =
            cm->above_contexts.txfm[tile_info->tile_row] + mi_col + x_idx;
        xd->left_txfm_context =
            xd->left_txfm_context_buffer + ((mi_row + y_idx) & MAX_MIB_MASK);
        if (!pc_tree->split[i]->none) {
          pc_tree->split[i]->none =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->split[i]->none)
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->split[i]->none);
        }
        pc_tree->split[i]->partitioning = PARTITION_NONE;
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx,
                            &block_rdc, subsize, pc_tree->split[i]->none);
        // TODO(yunqingwang): The rate here did not include the cost of
        // signaling PARTITION_NONE token in the sub-blocks.
        split_rdc.rate += block_rdc.rate;
        split_rdc.dist += block_rdc.dist;

        av1_rd_cost_update(x->rdmult, &split_rdc);

        if (none_rdc.rdcost < split_rdc.rdcost) {
          break;
        }

        if (i != SUB_PARTITIONS_SPLIT - 1)
          encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx,
                         1, subsize, PARTITION_NONE, pc_tree->split[i]->none,
                         NULL);
      }
      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      split_rdc.rdcost = RDCOST(x->rdmult, split_rdc.rate, split_rdc.dist);
    }
  }

  if (none_rdc.rdcost < split_rdc.rdcost) {
    /* Predicted samples can not be reused for PARTITION_NONE since same
     * buffer is being used to store the reconstructed samples of
     * PARTITION_SPLIT block. */
    if (do_split) x->reuse_inter_pred = false;

    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize, partition,
                   pc_tree->none, NULL);
  } else {
    mib[0]->bsize = subsize;
    pc_tree->partitioning = PARTITION_SPLIT;
    /* Predicted samples can not be reused for PARTITION_SPLIT since same
     * buffer is being used to write the reconstructed samples. */
    // TODO(Cherma): Store and reuse predicted samples generated by
    // encode_b_nonrd() in DRY_RUN_NORMAL mode.
    x->reuse_inter_pred = false;

    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      // Note: We don't reset pc_tree->split[i]->none here because it
      // could contain results from the additional check. Instead, it is
      // reset before we enter the nonrd_check_partition_merge_mode
      // condition.
      if (!pc_tree->split[i]->none) {
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->split[i]->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx, 0,
                     subsize, PARTITION_NONE, pc_tree->split[i]->none, NULL);
    }
  }
}